

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.hpp
# Opt level: O0

void __thiscall
rek::sample::AliasSampler::AliasSampler
          (AliasSampler *this,vector<double,_std::allocator<double>_> *probs)

{
  double dVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  ulong local_48;
  size_t j_1;
  size_t j;
  double sum;
  allocator<unsigned_int> local_19;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *probs_local;
  AliasSampler *this_local;
  
  local_18 = probs;
  probs_local = (vector<double,_std::allocator<double>_> *)this;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(probs);
  std::allocator<unsigned_int>::allocator(&local_19);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->A,sVar2 + 2,&local_19);
  std::allocator<unsigned_int>::~allocator(&local_19);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(local_18);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&sum + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->B,sVar2 + 2,(allocator<unsigned_int> *)((long)&sum + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&sum + 3));
  sVar2 = std::vector<double,_std::allocator<double>_>::size(local_18);
  std::allocator<double>::allocator((allocator<double> *)((long)&sum + 2));
  std::vector<double,_std::allocator<double>_>::vector
            (&this->Y,sVar2 + 2,(allocator<double> *)((long)&sum + 2));
  std::allocator<double>::~allocator((allocator<double> *)((long)&sum + 2));
  j = 0;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(local_18);
  this->N = (uint)sVar2;
  for (j_1 = 0; j_1 < this->N; j_1 = j_1 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_18,j_1);
    j = (size_t)(*pvVar3 + (double)j);
  }
  for (local_48 = 0; local_48 < this->N; local_48 = local_48 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_18,local_48);
    dVar1 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,local_48 + 1);
    *pvVar4 = dVar1 * (1.0 / (double)j);
  }
  return;
}

Assistant:

explicit AliasSampler(const std::vector<double> &probs)
      : A(probs.size() + 2), B(probs.size() + 2), Y(probs.size() + 2) {
    double sum = 0;

    this->N = (unsigned int)probs.size();
    for (size_t j = 0; j < N; j++) {
      sum += probs[j];
    }

    sum = 1 / sum;

    // Normalize it now
    for (size_t j = 0; j < N; j++) Y[j + 1] = probs[j] * sum;
  }